

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

int Exa_ManAddCnf(Exa_Man_t *p,int iMint)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int (*paiVar6) [32];
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  byte bVar14;
  bool bVar15;
  char cVar16;
  int pLits [3];
  int local_9c;
  uint local_98 [4];
  long local_88;
  long local_80;
  int (*local_78) [32];
  undefined8 local_70;
  int local_68;
  uint local_64;
  ulong local_60;
  ulong local_58;
  int (*local_50) [2] [32];
  ulong local_48;
  int (*local_40) [2] [32];
  long local_38;
  
  uVar8 = p->pTruth[iMint >> 6];
  iVar4 = p->nVars;
  if (0 < (long)iVar4) {
    lVar5 = 0;
    do {
      p->VarVals[lVar5] = (uint)(((uint)iMint >> ((uint)lVar5 & 0x1f) & 1) != 0);
      lVar5 = lVar5 + 1;
    } while (iVar4 != lVar5);
  }
  bmcg_sat_solver_set_nvars(p->pSat,p->nNodes * 3 + p->iVar);
  local_9c = p->nVars;
  local_88 = (long)local_9c;
  if (local_9c < p->nObjs) {
    local_50 = p->VarMarks;
    uVar9 = local_9c * 6;
    local_9c = local_9c * 3;
    local_64 = (uint)((uVar8 >> ((ulong)(uint)iMint & 0x3f) & 1) != 0);
    do {
      local_60 = (ulong)uVar9;
      uVar10 = p->nVars;
      local_48 = (ulong)uVar10;
      uVar3 = ((int)local_88 - uVar10) * 3 + p->iVar;
      local_58 = (ulong)uVar3;
      local_38 = (long)(int)uVar3;
      local_68 = uVar10 * 6;
      iVar4 = uVar9 + p->iVar * 2 + uVar10 * -6;
      local_40 = local_50 + local_88;
      local_80 = 0;
      do {
        if (0 < p->nObjs) {
          lVar5 = local_80 + local_38;
          uVar8 = 4;
          paiVar6 = *local_40 + local_80;
          lVar11 = 0;
          local_78 = paiVar6;
          do {
            if ((*paiVar6)[lVar11] != 0) {
              iVar2 = p->nVars;
              iVar7 = p->iVar;
              iVar13 = 0;
              local_70 = uVar8;
              do {
                if (((*paiVar6)[lVar11] < 0) ||
                   (local_98[0] = (*paiVar6)[lVar11] * 2 + 1, lVar5 < 0)) goto LAB_005a20b4;
                local_98[1] = iVar4 + iVar13;
                if (lVar11 < p->nVars) {
                  iVar1 = 2;
                  bVar14 = 0x10;
                  if (iVar13 != p->VarVals[lVar11]) goto LAB_005a1eda;
                }
                else {
                  if (((int)lVar11 - iVar2) * 3 + iVar7 < -2) goto LAB_005a20b4;
                  local_98[2] = iVar13 + (int)uVar8 + iVar7 * 2 + iVar2 * -6 ^ 1;
                  iVar1 = 3;
LAB_005a1eda:
                  iVar1 = bmcg_sat_solver_addclause(p->pSat,(int *)local_98,iVar1);
                  bVar14 = iVar1 == 0;
                }
                if ((bVar14 & 0xf) != 0) goto LAB_005a1f06;
                iVar13 = iVar13 + 1;
              } while (iVar13 == 1);
              bVar14 = 0;
LAB_005a1f06:
              paiVar6 = local_78;
              uVar8 = local_70;
              if (bVar14 != 0) {
                return 0;
              }
            }
            lVar11 = lVar11 + 1;
            uVar8 = (ulong)((int)uVar8 + 6);
          } while (lVar11 < p->nObjs);
        }
        lVar5 = local_80 + 1;
        iVar4 = iVar4 + 2;
        bVar15 = local_80 == 0;
        local_80 = lVar5;
      } while (bVar15);
      iVar2 = (int)local_58;
      local_78 = (int (*) [32])(ulong)(iVar2 * 2 + 4);
      uVar10 = (int)local_60 - local_68;
      iVar4 = (int)local_48;
      uVar9 = 0;
      do {
        if ((p->nObjs + -1 != (int)local_88) || (uVar9 != local_64)) {
          local_70 = CONCAT44(local_70._4_4_,(int)local_78 + uVar9) ^ 1;
          uVar8 = 0;
          uVar3 = uVar10;
          do {
            cVar16 = '\x16';
            uVar12 = (uint)uVar8;
            if (uVar9 != 1 || uVar12 != 0) {
              if ((int)local_58 < 0) {
LAB_005a20b4:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              local_98[0] = uVar12 & 1 | iVar2 * 2;
              local_98[1] = (int)(uVar8 >> 1) + iVar2 * 2 + 2;
              lVar5 = 2;
              if (p->nObjs + -1 != (int)local_88) {
                local_98[2] = (uint)local_70;
                lVar5 = 3;
              }
              iVar7 = (int)lVar5;
              if (uVar12 != 0) {
                if ((int)(local_9c + iVar4 * -3 + uVar12) < 0) goto LAB_005a20b4;
                iVar7 = iVar7 + 1;
                local_98[lVar5] = uVar3;
              }
              iVar7 = bmcg_sat_solver_addclause(p->pSat,(int *)local_98,iVar7);
              cVar16 = iVar7 == 0;
            }
            if ((cVar16 != '\x16') && (cVar16 != '\0')) {
              return 0;
            }
            uVar8 = (ulong)(uVar12 + 1);
            uVar3 = uVar3 + 2;
          } while (uVar12 + 1 != 4);
        }
        uVar10 = uVar10 + 1;
        bVar15 = uVar9 == 0;
        uVar9 = uVar9 + 1;
      } while (bVar15);
      local_88 = local_88 + 1;
      uVar9 = (int)local_60 + 6;
      local_9c = local_9c + 3;
    } while (local_88 < p->nObjs);
  }
  p->iVar = p->iVar + p->nNodes * 3;
  return 1;
}

Assistant:

int Exa_ManAddCnf( Exa_Man_t * p, int iMint )
{
    // save minterm values
    int i, k, n, j, Value = Abc_TtGetBit(p->pTruth, iMint);
    for ( i = 0; i < p->nVars; i++ )
        p->VarVals[i] = (iMint >> i) & 1;
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar + 3*p->nNodes );
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // fanin connectivity
        int iVarStart = 1 + 3*(i - p->nVars);
        int iBaseSatVarI = p->iVar + 3*(i - p->nVars);
        for ( k = 0; k < 2; k++ )
        {
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            {
                int iBaseSatVarJ = p->iVar + 3*(j - p->nVars);
                for ( n = 0; n < 2; n++ )
                {
                    int pLits[3], nLits = 0;
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                    pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + k, n );
                    if ( j >= p->nVars )
                        pLits[nLits++] = Abc_Var2Lit( iBaseSatVarJ + 2, !n );
                    else if ( p->VarVals[j] == n )
                        continue;
                    if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                        return 0;
                }
            }
        }
        // node functionality
        for ( n = 0; n < 2; n++ )
        {
            if ( i == p->nObjs - 1 && n == Value )
                continue;
            for ( k = 0; k < 4; k++ )
            {
                int pLits[4], nLits = 0;
                if ( k == 0 && n == 1 )
                    continue;
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 0, (k&1)  );
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 1, (k>>1) );
                if ( i != p->nObjs - 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 2, !n );
                if ( k > 0 )             pLits[nLits++] = Abc_Var2Lit( iVarStart +  k-1,  n );
                assert( nLits <= 4 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                    return 0;
            }
        }
    }
    p->iVar += 3*p->nNodes;
    return 1;
}